

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

void FT_Request_Metrics(FT_Face face,FT_Size_Request req)

{
  FT_Size_Metrics *metrics;
  FT_Size_Request_Type FVar1;
  FT_Size pFVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong b_;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  
  pFVar2 = face->size;
  metrics = &pFVar2->metrics;
  if ((face->face_flags & 1) == 0) {
    (pFVar2->metrics).descender = 0;
    (pFVar2->metrics).height = 0;
    (pFVar2->metrics).y_scale = 0;
    (pFVar2->metrics).ascender = 0;
    metrics->x_ppem = 0;
    metrics->y_ppem = 0;
    *(undefined4 *)&metrics->field_0x4 = 0;
    (pFVar2->metrics).x_scale = 0;
    (pFVar2->metrics).max_advance = 0;
    (pFVar2->metrics).x_scale = 0x10000;
    (pFVar2->metrics).y_scale = 0x10000;
    return;
  }
  FVar1 = req->type;
  switch(FVar1) {
  case FT_SIZE_REQUEST_TYPE_NOMINAL:
    b_ = (ulong)face->units_per_EM;
    uVar7 = b_;
    goto LAB_001ec76b;
  case FT_SIZE_REQUEST_TYPE_REAL_DIM:
    uVar7 = (long)face->ascender - (long)face->descender;
    uVar6 = uVar7;
    break;
  case FT_SIZE_REQUEST_TYPE_BBOX:
    uVar7 = (face->bbox).xMax - (face->bbox).xMin;
    uVar6 = (face->bbox).yMax - (face->bbox).yMin;
    break;
  case FT_SIZE_REQUEST_TYPE_CELL:
    uVar7 = (ulong)face->max_advance_width;
    uVar6 = (long)face->ascender - (long)face->descender;
    break;
  case FT_SIZE_REQUEST_TYPE_SCALES:
    uVar7 = req->width;
    (pFVar2->metrics).x_scale = uVar7;
    uVar6 = req->height;
    (pFVar2->metrics).y_scale = uVar6;
    if (uVar7 == 0) {
      (pFVar2->metrics).x_scale = uVar6;
      uVar7 = uVar6;
    }
    else if (uVar6 == 0) {
      (pFVar2->metrics).y_scale = uVar7;
      uVar6 = uVar7;
    }
    goto LAB_001ec90c;
  default:
    b_ = 0;
    uVar7 = 0;
    goto LAB_001ec76b;
  }
  b_ = -uVar7;
  if (0 < (long)uVar7) {
    b_ = uVar7;
  }
  uVar7 = -uVar6;
  if (0 < (long)uVar6) {
    uVar7 = uVar6;
  }
LAB_001ec76b:
  lVar10 = req->width;
  lVar9 = lVar10;
  if ((ulong)req->horiResolution != 0) {
    lVar3 = (ulong)req->horiResolution * lVar10 + 0x24;
    lVar9 = lVar3 >> 0x3f;
    lVar9 = (lVar3 / 0x12 + lVar9 >> 2) - lVar9;
  }
  lVar3 = req->height;
  lVar12 = lVar3;
  if ((ulong)req->vertResolution != 0) {
    lVar4 = (ulong)req->vertResolution * lVar3 + 0x24;
    lVar12 = lVar4 >> 0x3f;
    lVar12 = (lVar4 / 0x12 + lVar12 >> 2) - lVar12;
  }
  if (lVar10 == 0) {
    if (uVar7 == 0) {
      uVar6 = 0x7fffffff;
    }
    else {
      lVar10 = -lVar12;
      if (0 < lVar12) {
        lVar10 = lVar12;
      }
      uVar6 = ((uVar7 >> 1) + lVar10 * 0x10000) / uVar7;
    }
    uVar5 = -uVar6;
    if (-1 < lVar12) {
      uVar5 = uVar6;
    }
    (pFVar2->metrics).y_scale = uVar5;
    (pFVar2->metrics).x_scale = uVar5;
    lVar9 = FT_MulDiv(lVar12,b_,uVar7);
    uVar6 = uVar5;
LAB_001ec8ed:
    iVar11 = (int)lVar12;
    iVar8 = (int)lVar9;
    uVar7 = uVar6;
    uVar6 = uVar5;
    if (FVar1 == FT_SIZE_REQUEST_TYPE_NOMINAL) goto LAB_001ec949;
  }
  else {
    if (b_ == 0) {
      uVar5 = 0x7fffffff;
    }
    else {
      lVar10 = -lVar9;
      if (0 < lVar9) {
        lVar10 = lVar9;
      }
      uVar5 = ((b_ >> 1) + lVar10 * 0x10000) / b_;
    }
    uVar6 = -uVar5;
    if (-1 < lVar9) {
      uVar6 = uVar5;
    }
    (pFVar2->metrics).x_scale = uVar6;
    if (lVar3 == 0) {
      (pFVar2->metrics).y_scale = uVar6;
      lVar12 = FT_MulDiv(lVar9,uVar7,b_);
      uVar5 = uVar6;
      goto LAB_001ec8ed;
    }
    if (uVar7 == 0) {
      uVar7 = 0x7fffffff;
    }
    else {
      lVar10 = -lVar12;
      if (0 < lVar12) {
        lVar10 = lVar12;
      }
      uVar7 = ((uVar7 >> 1) + lVar10 * 0x10000) / uVar7;
    }
    uVar5 = -uVar7;
    if (-1 < lVar12) {
      uVar5 = uVar7;
    }
    (pFVar2->metrics).y_scale = uVar5;
    if (FVar1 != FT_SIZE_REQUEST_TYPE_CELL) goto LAB_001ec8ed;
    if ((long)uVar6 < (long)uVar5) {
      (pFVar2->metrics).y_scale = uVar6;
      uVar7 = uVar6;
    }
    else {
      (pFVar2->metrics).x_scale = uVar5;
      uVar7 = uVar5;
      uVar6 = uVar5;
    }
  }
LAB_001ec90c:
  lVar10 = (long)(int)uVar7 * (ulong)face->units_per_EM;
  iVar8 = (int)((ulong)(lVar10 + 0x8000 + (lVar10 >> 0x3f)) >> 0x10);
  lVar10 = (long)(int)uVar6 * (ulong)face->units_per_EM;
  iVar11 = (int)((ulong)(lVar10 + 0x8000 + (lVar10 >> 0x3f)) >> 0x10);
LAB_001ec949:
  (pFVar2->metrics).x_ppem = (FT_UShort)(iVar8 + 0x20U >> 6);
  (pFVar2->metrics).y_ppem = (FT_UShort)(iVar11 + 0x20U >> 6);
  ft_recompute_scaled_metrics(face,metrics);
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_Request_Metrics( FT_Face          face,
                      FT_Size_Request  req )
  {
    FT_Size_Metrics*  metrics;


    metrics = &face->size->metrics;

    if ( FT_IS_SCALABLE( face ) )
    {
      FT_Long  w = 0, h = 0, scaled_w = 0, scaled_h = 0;


      switch ( req->type )
      {
      case FT_SIZE_REQUEST_TYPE_NOMINAL:
        w = h = face->units_per_EM;
        break;

      case FT_SIZE_REQUEST_TYPE_REAL_DIM:
        w = h = face->ascender - face->descender;
        break;

      case FT_SIZE_REQUEST_TYPE_BBOX:
        w = face->bbox.xMax - face->bbox.xMin;
        h = face->bbox.yMax - face->bbox.yMin;
        break;

      case FT_SIZE_REQUEST_TYPE_CELL:
        w = face->max_advance_width;
        h = face->ascender - face->descender;
        break;

      case FT_SIZE_REQUEST_TYPE_SCALES:
        metrics->x_scale = (FT_Fixed)req->width;
        metrics->y_scale = (FT_Fixed)req->height;
        if ( !metrics->x_scale )
          metrics->x_scale = metrics->y_scale;
        else if ( !metrics->y_scale )
          metrics->y_scale = metrics->x_scale;
        goto Calculate_Ppem;

      case FT_SIZE_REQUEST_TYPE_MAX:
        break;
      }

      /* to be on the safe side */
      if ( w < 0 )
        w = -w;

      if ( h < 0 )
        h = -h;

      scaled_w = FT_REQUEST_WIDTH ( req );
      scaled_h = FT_REQUEST_HEIGHT( req );

      /* determine scales */
      if ( req->width )
      {
        metrics->x_scale = FT_DivFix( scaled_w, w );

        if ( req->height )
        {
          metrics->y_scale = FT_DivFix( scaled_h, h );

          if ( req->type == FT_SIZE_REQUEST_TYPE_CELL )
          {
            if ( metrics->y_scale > metrics->x_scale )
              metrics->y_scale = metrics->x_scale;
            else
              metrics->x_scale = metrics->y_scale;
          }
        }
        else
        {
          metrics->y_scale = metrics->x_scale;
          scaled_h = FT_MulDiv( scaled_w, h, w );
        }
      }
      else
      {
        metrics->x_scale = metrics->y_scale = FT_DivFix( scaled_h, h );
        scaled_w = FT_MulDiv( scaled_h, w, h );
      }

  Calculate_Ppem:
      /* calculate the ppems */
      if ( req->type != FT_SIZE_REQUEST_TYPE_NOMINAL )
      {
        scaled_w = FT_MulFix( face->units_per_EM, metrics->x_scale );
        scaled_h = FT_MulFix( face->units_per_EM, metrics->y_scale );
      }

      metrics->x_ppem = (FT_UShort)( ( scaled_w + 32 ) >> 6 );
      metrics->y_ppem = (FT_UShort)( ( scaled_h + 32 ) >> 6 );

      ft_recompute_scaled_metrics( face, metrics );
    }
    else
    {
      FT_ZERO( metrics );
      metrics->x_scale = 1L << 16;
      metrics->y_scale = 1L << 16;
    }
  }